

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugLine::ParsingState::appendRowToMatrix(ParsingState *this)

{
  Sequence *__args;
  pointer *ppRVar1;
  pointer *ppSVar2;
  LineTable *pLVar3;
  iterator __position;
  iterator __position_00;
  uint64_t uVar4;
  uint64_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  uint8_t uVar9;
  undefined3 uVar10;
  undefined7 uVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  
  pLVar3 = this->LineTable;
  __position._M_current =
       (pLVar3->Rows).
       super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  uVar14 = (uint)((ulong)((long)__position._M_current -
                         (long)(pLVar3->Rows).
                               super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if ((this->Sequence).Empty == true) {
    (this->Sequence).Empty = false;
    (this->Sequence).LowPC = (this->Row).Address.Address;
    (this->Sequence).FirstRowIndex = uVar14;
  }
  if (__position._M_current ==
      (pLVar3->Rows).
      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::DWARFDebugLine::Row,std::allocator<llvm::DWARFDebugLine::Row>>::
    _M_realloc_insert<llvm::DWARFDebugLine::Row_const&>
              ((vector<llvm::DWARFDebugLine::Row,std::allocator<llvm::DWARFDebugLine::Row>> *)
               &pLVar3->Rows,__position,&this->Row);
  }
  else {
    uVar4 = (this->Row).Address.Address;
    uVar5 = (this->Row).Address.SectionIndex;
    uVar6 = (this->Row).Column;
    uVar7 = (this->Row).File;
    uVar8 = (this->Row).Discriminator;
    uVar9 = (this->Row).Isa;
    uVar10 = *(undefined3 *)&(this->Row).field_0x1d;
    (__position._M_current)->Line = (this->Row).Line;
    (__position._M_current)->Column = uVar6;
    (__position._M_current)->File = uVar7;
    (__position._M_current)->Discriminator = uVar8;
    (__position._M_current)->Isa = uVar9;
    *(undefined3 *)&(__position._M_current)->field_0x1d = uVar10;
    ((__position._M_current)->Address).Address = uVar4;
    ((__position._M_current)->Address).SectionIndex = uVar5;
    ppRVar1 = &(pLVar3->Rows).
               super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
  bVar13 = (this->Row).field_0x1d;
  if ((bVar13 & 4) != 0) {
    __args = &this->Sequence;
    uVar14 = uVar14 + 1;
    (this->Sequence).LastRowIndex = uVar14;
    uVar4 = (this->Row).Address.SectionIndex;
    (this->Sequence).HighPC = (this->Row).Address.Address;
    (this->Sequence).SectionIndex = uVar4;
    if ((((this->Sequence).Empty == false) && ((this->Sequence).LowPC < (this->Row).Address.Address)
        ) && ((this->Sequence).FirstRowIndex < uVar14)) {
      pLVar3 = this->LineTable;
      __position_00._M_current =
           (pLVar3->Sequences).
           super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (pLVar3->Sequences).
          super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::DWARFDebugLine::Sequence,std::allocator<llvm::DWARFDebugLine::Sequence>>::
        _M_realloc_insert<llvm::DWARFDebugLine::Sequence_const&>
                  ((vector<llvm::DWARFDebugLine::Sequence,std::allocator<llvm::DWARFDebugLine::Sequence>>
                    *)&pLVar3->Sequences,__position_00,__args);
      }
      else {
        uVar11 = *(undefined7 *)&(this->Sequence).field_0x21;
        (__position_00._M_current)->Empty = (this->Sequence).Empty;
        *(undefined7 *)&(__position_00._M_current)->field_0x21 = uVar11;
        uVar4 = __args->LowPC;
        uVar5 = (this->Sequence).HighPC;
        uVar14 = (this->Sequence).FirstRowIndex;
        uVar12 = (this->Sequence).LastRowIndex;
        (__position_00._M_current)->SectionIndex = (this->Sequence).SectionIndex;
        (__position_00._M_current)->FirstRowIndex = uVar14;
        (__position_00._M_current)->LastRowIndex = uVar12;
        (__position_00._M_current)->LowPC = uVar4;
        (__position_00._M_current)->HighPC = uVar5;
        ppSVar2 = &(pLVar3->Sequences).
                   super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar2 = *ppSVar2 + 1;
      }
    }
    __args->LowPC = 0;
    (this->Sequence).HighPC = 0;
    (this->Sequence).SectionIndex = 0xffffffffffffffff;
    (this->Sequence).FirstRowIndex = 0;
    (this->Sequence).LastRowIndex = 0;
    (this->Sequence).Empty = true;
    bVar13 = (this->Row).field_0x1d;
  }
  (this->Row).Discriminator = 0;
  (this->Row).field_0x1d = bVar13 & 0xe5;
  return;
}

Assistant:

void DWARFDebugLine::ParsingState::appendRowToMatrix() {
  unsigned RowNumber = LineTable->Rows.size();
  if (Sequence.Empty) {
    // Record the beginning of instruction sequence.
    Sequence.Empty = false;
    Sequence.LowPC = Row.Address.Address;
    Sequence.FirstRowIndex = RowNumber;
  }
  LineTable->appendRow(Row);
  if (Row.EndSequence) {
    // Record the end of instruction sequence.
    Sequence.HighPC = Row.Address.Address;
    Sequence.LastRowIndex = RowNumber + 1;
    Sequence.SectionIndex = Row.Address.SectionIndex;
    if (Sequence.isValid())
      LineTable->appendSequence(Sequence);
    Sequence.reset();
  }
  Row.postAppend();
}